

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl::commitFlips(Private_Impl *this)

{
  int iVar1;
  int iVar2;
  MMAL_STATUS_T MVar3;
  ostream *poVar4;
  MMAL_PARAMETER_MIRROR_T mirror;
  
  mirror.hdr.id = 0x1000f;
  mirror.hdr.size = 0xc;
  mirror.value = MMAL_PARAM_MIRROR_NONE;
  iVar1 = (this->State).hflip;
  iVar2 = (this->State).vflip;
  if (iVar1 != 0 || iVar2 != 0) {
    mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
    if (iVar1 != 0) {
      mirror.value = (iVar1 != 0 && iVar2 != 0) | MMAL_PARAM_MIRROR_HORIZONTAL;
    }
  }
  MVar3 = mmal_port_parameter_set(*((this->State).camera_component)->output,&mirror.hdr);
  if (((MVar3 != MMAL_SUCCESS) ||
      (MVar3 = mmal_port_parameter_set(((this->State).camera_component)->output[1],&mirror.hdr),
      MVar3 != MMAL_SUCCESS)) ||
     (MVar3 = mmal_port_parameter_set(((this->State).camera_component)->output[2],&mirror.hdr),
     MVar3 != MMAL_SUCCESS)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"commitFlips");
    std::operator<<(poVar4,": Failed to set horizontal/vertical flip parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( State.hflip && State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( State.hflip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( State.camera_component->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[2], &mirror.hdr ) )
                cout << __func__ << ": Failed to set horizontal/vertical flip parameter.\n";
        }